

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O2

bool __thiscall
ExpressionFunctionHandler::addFunction
          (ExpressionFunctionHandler *this,Identifier *name,ExpressionFunction functor,
          size_t minParams,size_t maxParams,ExpFuncSafety safety)

{
  bool bVar1;
  string *this_00;
  anon_class_40_2_f5e256a9 executor;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  size_t local_48;
  size_t local_40;
  ExpFuncSafety local_38;
  
  std::__cxx11::string::string((string *)&executor,(string *)name);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  executor.functor = functor;
  this_00 = (string *)operator_new(0x28);
  std::__cxx11::string::string(this_00,(string *)&executor);
  *(ExpressionFunction *)(this_00 + 0x20) = executor.functor;
  pcStack_50 = std::
               _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:60:18)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:60:18)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)this_00;
  local_48 = minParams;
  local_40 = maxParams;
  local_38 = safety;
  bVar1 = registerEntry(this,name,(Entry *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&executor);
  return bVar1;
}

Assistant:

bool ExpressionFunctionHandler::addFunction(const Identifier &name, ExpressionFunction functor, size_t minParams, size_t maxParams, ExpFuncSafety safety)
{
	auto executor = [name, functor](const std::vector<std::unique_ptr<ExpressionInternal>> &parameters) -> ExpressionValue
	{
		// evaluate parameters
		std::vector<ExpressionValue> params;
		params.reserve(parameters.size());

		for (size_t i = 0; i < parameters.size(); i++)
		{
			ExpressionValue result = parameters[i]->evaluate();
			if (!result.isValid())
			{
				Logger::queueError(Logger::Error, "%s: Invalid parameter %d", name, i+1);
				return result;
			}

			params.push_back(result);
		}

		// execute
		return functor(name, params);
	};

	return registerEntry(name, Entry{std::move(executor), minParams, maxParams, safety});
}